

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O2

void * Kernel::FlatTerm::operator_new(size_t sz,uint num)

{
  void *pvVar1;
  size_t size;
  
  size = 0x10;
  if (num != 0) {
    size = (ulong)(num - 1) * 8 + 0x10;
  }
  pvVar1 = Lib::alloc(size);
  return pvVar1;
}

Assistant:

void* FlatTerm::operator new(size_t sz,unsigned num)
{
  ASS_GE(num,0);
  ASS_EQ(sz, sizeof(FlatTerm));

  //one entry is already accounted for in the size of the FlatTerm object
  size_t size = sizeof(FlatTerm);
  if (num > 0) {
    size += (num-1)*sizeof(Entry);
  }

  return ALLOC_KNOWN(size,"FlatTerm");
}